

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexHull.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChConvexHull2D::ComputeGraham
          (ChConvexHull2D *this,
          vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_> *points,
          size_t n)

{
  __normal_iterator<chrono::ChVector2<double>_*,_std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  __first;
  double dVar1;
  pointer pCVar2;
  __normal_iterator<chrono::ChVector2<double>_*,_std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  __last;
  double dVar3;
  ulong uVar4;
  pointer pCVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  _Iter_comp_iter<chrono::utils::PolarOrder> local_30;
  _Iter_comp_iter<chrono::utils::PolarOrder> local_20;
  
  pCVar2 = (points->
           super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (points->
       super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)__last._M_current - (long)pCVar2 >> 4;
  if (uVar4 < 2) {
    uVar8 = 0;
  }
  else {
    pdVar6 = pCVar2[1].m_data + 1;
    uVar7 = 1;
    uVar9 = 0;
    do {
      dVar3 = *pdVar6 - pCVar2[uVar9].m_data[1];
      uVar8 = uVar7;
      if ((((0.0 <= dVar3) && (uVar8 = uVar9, dVar3 == 0.0)) && (!NAN(dVar3))) &&
         (((ChVector2<double> *)(pdVar6 + -1))->m_data[0] < pCVar2[uVar9].m_data[0])) {
        uVar8 = uVar7;
      }
      uVar7 = uVar7 + 1;
      pdVar6 = pdVar6 + 2;
      uVar9 = uVar8;
    } while (uVar4 != uVar7);
  }
  dVar3 = pCVar2->m_data[0];
  dVar1 = pCVar2->m_data[1];
  pCVar5 = pCVar2 + uVar8;
  if (uVar8 != 0) {
    pCVar2->m_data[0] = pCVar5->m_data[0];
    pCVar2->m_data[1] = pCVar5->m_data[1];
  }
  pCVar5->m_data[0] = dVar3;
  pCVar5->m_data[1] = dVar1;
  __first._M_current = pCVar2 + 1;
  if (__first._M_current != __last._M_current) {
    dVar3 = pCVar2->m_data[0];
    dVar1 = pCVar2->m_data[1];
    local_20._M_comp.m_pivot.m_data[0] = dVar3;
    local_20._M_comp.m_pivot.m_data[1] = dVar1;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<chrono::utils::PolarOrder>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 4) *
                            2) ^ 0x7e,&local_20);
    local_30._M_comp.m_pivot.m_data[0] = dVar3;
    local_30._M_comp.m_pivot.m_data[1] = dVar1;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<chrono::ChVector2<double>*,std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<chrono::utils::PolarOrder>>
              (__first,__last,&local_30);
  }
  return;
}

Assistant:

void ChConvexHull2D::ComputeGraham(std::vector<ChVector2<>>& points, size_t n) {
    // Find point with lowest y. Ties are broken for lowest x.
    size_t first = 0;
    for (size_t i = 1; i < points.size(); i++) {
        double dy = points[i].y() - points[first].y();
        if (dy < 0)
            first = i;
        else if (dy == 0 && points[i].x() < points[first].x())
            first = i;
    }

    // Swap this point in first position
    ChVector2<> tmp = points[0];
    points[0] = points[first];
    points[first] = tmp;

    // Sort the remaining points by polar order about the pivot.
    size_t pivot = 0;
    std::sort(std::next(points.begin()), points.end(), PolarOrder(points[pivot]));

    // Graham scan

    //// TODO
}